

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringBuilder.cpp
# Opt level: O1

void __thiscall
Js::JSONStringBuilder::AppendArrayString(JSONStringBuilder *this,JSONArray *valueArray)

{
  uint uVar1;
  uint32 uVar2;
  char16 *pcVar3;
  uint32 uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = valueArray->length;
  if (uVar1 == 0) {
    AppendCharacter(this,L'[');
    AppendCharacter(this,L']');
    return;
  }
  uVar2 = this->indentLevel;
  this->indentLevel = uVar2 + 1;
  AppendCharacter(this,L'[');
  if (this->gap != (char16 *)0x0) {
    AppendCharacter(this,L'\n');
    for (uVar4 = this->indentLevel; uVar4 != 0; uVar4 = uVar4 - 1) {
      AppendBuffer(this,this->gap,this->gapLength);
    }
  }
  AppendJSONPropertyString(this,(JSONProperty *)(valueArray + 1));
  if (uVar1 != 1) {
    uVar5 = 2;
    if (2 < uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar6 = 1;
    do {
      pcVar3 = this->gap;
      AppendCharacter(this,L',');
      if (pcVar3 != (char16 *)0x0) {
        AppendCharacter(this,L'\n');
        for (uVar4 = this->indentLevel; uVar4 != 0; uVar4 = uVar4 - 1) {
          AppendBuffer(this,this->gap,this->gapLength);
        }
      }
      AppendJSONPropertyString(this,(JSONProperty *)(valueArray + 1) + uVar6);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  if (this->gap != (char16 *)0x0) {
    AppendCharacter(this,L'\n');
    for (uVar4 = uVar2; uVar4 != 0; uVar4 = uVar4 - 1) {
      AppendBuffer(this,this->gap,this->gapLength);
    }
  }
  AppendCharacter(this,L']');
  this->indentLevel = uVar2;
  return;
}

Assistant:

void
JSONStringBuilder::AppendArrayString(_In_ JSONArray* valueArray)
{
    uint32 length = valueArray->length;
    if (length == 0)
    {
        this->AppendCharacter(_u('['));
        this->AppendCharacter(_u(']'));
        return;
    }

    const uint32 stepbackLevel = this->indentLevel;
    ++this->indentLevel;

    JSONProperty* arr = valueArray->arr;

    this->AppendCharacter(_u('['));

    if (this->gap != nullptr)
    {
        this->AppendCharacter(_u('\n'));
        this->AppendGap(indentLevel);
    }

    this->AppendJSONPropertyString(&arr[0]);

    for (uint32 i = 1; i < length; ++i)
    {
        if (this->gap == nullptr)
        {
            this->AppendCharacter(_u(','));
        }
        else
        {
            this->AppendCharacter(_u(','));
            this->AppendCharacter(_u('\n'));
            this->AppendGap(indentLevel);
        }
        AppendJSONPropertyString(&arr[i]);
    }

    if (this->gap != nullptr)
    {
        this->AppendCharacter(_u('\n'));
        this->AppendGap(stepbackLevel);
    }
    this->AppendCharacter(_u(']'));

    this->indentLevel = stepbackLevel;
}